

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::unsimplify(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *x,
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *r,VarStatus *rows,VarStatus *cols,bool isOptimal)

{
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *this_00;
  uint *puVar1;
  SPxSense SVar2;
  fpclass_type fVar3;
  fpclass_type fVar4;
  pointer pnVar5;
  int32_t iVar8;
  int32_t iVar9;
  long *plVar6;
  pointer pnVar7;
  long lVar10;
  bool bVar11;
  SPxOut *pSVar12;
  fpclass_type *pfVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint *puVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  ulong uVar20;
  byte bVar21;
  Verbosity old_verbosity;
  uint local_468;
  bool local_464;
  fpclass_type local_460;
  int32_t iStack_45c;
  VarStatus *local_458;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar21 = 0;
  pSVar12 = (this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).spxout;
  local_458 = rows;
  if ((pSVar12 != (SPxOut *)0x0) && (2 < (int)pSVar12->m_verbosity)) {
    old_verbosity = pSVar12->m_verbosity;
    (*pSVar12->_vptr_SPxOut[2])();
    pSVar12 = soplex::operator<<((this->
                                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).spxout," --- unsimplifying solution and basis");
    std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
    (*((this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).spxout)->_vptr_SPxOut[2])();
  }
  lVar15 = 0x1e;
  lVar10 = 0x1c;
  for (lVar16 = 0;
      pnVar5 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar16 < (int)((ulong)((long)(x->val).
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar5) >> 7);
      lVar16 = lVar16 + 1) {
    puVar1 = (pnVar5->m_backend).data._M_elems + lVar15;
    puVar17 = puVar1 + 0xffffffffffffffe2;
    pnVar19 = &local_2b0;
    for (lVar14 = lVar10; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = *puVar17;
      puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = puVar1[0xfffffffffffffffe];
    local_2b0.m_backend.neg = *(bool *)(puVar1 + 0xffffffffffffffff);
    local_2b0.m_backend.fpclass = puVar1[0];
    local_2b0.m_backend.prec_elem = puVar1[1];
    epsZero(&local_b0,this);
    bVar11 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_2b0,&local_b0);
    if (bVar11) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
    }
    else {
      puVar1 = (((x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar15;
      puVar17 = puVar1 + 0xffffffffffffffe2;
      pcVar18 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
      for (lVar14 = lVar10; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pcVar18->data)._M_elems[0] = *puVar17;
        puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar21 * -8 + 4);
      }
      local_468 = puVar1[0xfffffffffffffffe];
      local_464 = (bool)*(byte *)(puVar1 + 0xffffffffffffffff);
      local_460 = puVar1[0];
      iStack_45c = puVar1[1];
    }
    puVar1 = (((this->m_prim).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar15;
    pcVar18 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
    puVar17 = puVar1 + 0xffffffffffffffe2;
    for (lVar14 = lVar10; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar17 = (pcVar18->data)._M_elems[0];
      pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar21 * -8 + 4);
      puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
    }
    puVar1[0xfffffffffffffffe] = local_468;
    *(bool *)(puVar1 + 0xffffffffffffffff) = local_464;
    puVar1[0] = local_460;
    puVar1[1] = iStack_45c;
    puVar1 = (((r->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar15 + -0x1e
    ;
    puVar17 = puVar1;
    pnVar19 = &local_430;
    for (lVar14 = lVar10; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = *puVar17;
      puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    local_430.m_backend.exp = puVar1[0x1c];
    local_430.m_backend.neg = SUB41(puVar1[0x1d],0);
    local_430.m_backend.fpclass = puVar1[0x1e];
    local_430.m_backend.prec_elem = puVar1[0x1f];
    epsZero(&local_130,this);
    bVar11 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_430,&local_130);
    if (bVar11) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
    }
    else {
      SVar2 = this->m_thesense;
      puVar1 = (((r->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
               lVar15 + -0x1e;
      puVar17 = puVar1;
      pcVar18 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
      for (lVar14 = lVar10; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pcVar18->data)._M_elems[0] = *puVar17;
        puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar21 * -8 + 4);
      }
      local_468 = puVar1[0x1c];
      local_464 = (bool)(byte)puVar1[0x1d];
      fVar3 = puVar1[0x1e];
      iVar8 = puVar1[0x1f];
      local_460 = fVar3;
      iStack_45c = iVar8;
      if ((SVar2 == MAXIMIZE) && (fVar3 != cpp_dec_float_finite || old_verbosity != ERROR)) {
        local_464 = (bool)((byte)puVar1[0x1d] ^ 1);
      }
    }
    puVar1 = (((this->m_redCost).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar15;
    pcVar18 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
    puVar17 = puVar1 + 0xffffffffffffffe2;
    for (lVar14 = lVar10; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar17 = (pcVar18->data)._M_elems[0];
      pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar21 * -8 + 4);
      puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
    }
    puVar1[0xfffffffffffffffe] = local_468;
    *(bool *)(puVar1 + 0xffffffffffffffff) = local_464;
    puVar1[0] = local_460;
    puVar1[1] = iStack_45c;
    (this->m_cBasisStat).data[lVar16] = cols[lVar16];
    lVar15 = lVar15 + 0x20;
  }
  lVar15 = 0x1e;
  lVar10 = 0x1c;
  for (lVar16 = 0;
      pnVar5 = (y->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar16 < (int)((ulong)((long)(y->val).
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar5) >> 7);
      lVar16 = lVar16 + 1) {
    puVar1 = (pnVar5->m_backend).data._M_elems + lVar15;
    puVar17 = puVar1 + 0xffffffffffffffe2;
    pnVar19 = &local_330;
    for (lVar14 = lVar10; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = *puVar17;
      puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    local_330.m_backend.exp = puVar1[0xfffffffffffffffe];
    local_330.m_backend.neg = *(bool *)(puVar1 + 0xffffffffffffffff);
    local_330.m_backend.fpclass = puVar1[0];
    local_330.m_backend.prec_elem = puVar1[1];
    epsZero(&local_1b0,this);
    bVar11 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_330,&local_1b0);
    if (bVar11) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
    }
    else {
      SVar2 = this->m_thesense;
      puVar1 = (((y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
               lVar15 + -0x1e;
      puVar17 = puVar1;
      pcVar18 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
      for (lVar14 = lVar10; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pcVar18->data)._M_elems[0] = *puVar17;
        puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar21 * -8 + 4);
      }
      local_468 = puVar1[0x1c];
      local_464 = (bool)(byte)puVar1[0x1d];
      fVar4 = puVar1[0x1e];
      iVar9 = puVar1[0x1f];
      local_460 = fVar4;
      iStack_45c = iVar9;
      if ((SVar2 == MAXIMIZE) && (fVar4 != cpp_dec_float_finite || old_verbosity != ERROR)) {
        local_464 = (bool)((byte)puVar1[0x1d] ^ 1);
      }
    }
    puVar1 = (((this->m_dual).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar15;
    pcVar18 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
    puVar17 = puVar1 + 0xffffffffffffffe2;
    for (lVar14 = lVar10; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar17 = (pcVar18->data)._M_elems[0];
      pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar21 * -8 + 4);
      puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
    }
    puVar1[0xfffffffffffffffe] = local_468;
    *(bool *)(puVar1 + 0xffffffffffffffff) = local_464;
    puVar1[0] = local_460;
    puVar1[1] = iStack_45c;
    puVar1 = (((s->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar15 + -0x1e
    ;
    puVar17 = puVar1;
    pnVar19 = &local_3b0;
    for (lVar14 = lVar10; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = *puVar17;
      puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    local_3b0.m_backend.exp = puVar1[0x1c];
    local_3b0.m_backend.neg = SUB41(puVar1[0x1d],0);
    local_3b0.m_backend.fpclass = puVar1[0x1e];
    local_3b0.m_backend.prec_elem = puVar1[0x1f];
    epsZero(&local_230,this);
    bVar11 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_3b0,&local_230);
    if (bVar11) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
    }
    else {
      puVar1 = (((s->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar15;
      puVar17 = puVar1 + 0xffffffffffffffe2;
      pcVar18 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
      for (lVar14 = lVar10; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pcVar18->data)._M_elems[0] = *puVar17;
        puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar21 * -8 + 4);
      }
      local_468 = puVar1[0xfffffffffffffffe];
      local_464 = (bool)*(byte *)(puVar1 + 0xffffffffffffffff);
      local_460 = puVar1[0];
      iStack_45c = puVar1[1];
    }
    puVar1 = (((this->m_slack).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar15;
    pcVar18 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
    puVar17 = puVar1 + 0xffffffffffffffe2;
    for (lVar14 = lVar10; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar17 = (pcVar18->data)._M_elems[0];
      pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar21 * -8 + 4);
      puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
    }
    puVar1[0xfffffffffffffffe] = local_468;
    *(bool *)(puVar1 + 0xffffffffffffffff) = local_464;
    puVar1[0] = local_460;
    puVar1[1] = iStack_45c;
    (this->m_rBasisStat).data[lVar16] = local_458[lVar16];
    lVar15 = lVar15 + 0x20;
  }
  this_00 = &this->m_hist;
  uVar20 = (ulong)((long)(this->m_hist).data.
                         super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_hist).data.
                        super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 4 & 0xffffffff;
  while (0 < (int)uVar20) {
    uVar20 = uVar20 - 1;
    (**(code **)(*(long *)(this_00->data).
                          super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar20 & 0xffffffff].
                          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x10))();
    plVar6 = (long *)(this_00->data).
                     super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar20 & 0xffffffff].
                     super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
    (**(code **)(*plVar6 + 0x20))
              (plVar6,&this->m_prim,&this->m_dual,&this->m_slack,&this->m_redCost,
               &this->m_cBasisStat,&this->m_rBasisStat,isOptimal);
    Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
    ::reSize(this_00,(int)uVar20);
  }
  if (this->m_thesense == MAXIMIZE) {
    pnVar5 = (this->m_redCost).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar7 = (this->m_redCost).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pfVar13 = &(pnVar5->m_backend).fpclass;
    for (lVar15 = 0; lVar15 < (int)((ulong)((long)pnVar7 - (long)pnVar5) >> 7); lVar15 = lVar15 + 1)
    {
      *(char *)(pfVar13 + -1) =
           *(bool *)(pfVar13 + -1) ^
           ((((cpp_dec_float<200U,_int,_void> *)(pfVar13 + -0x1e))->data)._M_elems[0] != 0 ||
           *pfVar13 != cpp_dec_float_finite);
      pfVar13 = pfVar13 + 0x20;
    }
    pnVar5 = (this->m_dual).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar7 = (this->m_dual).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pfVar13 = &(pnVar5->m_backend).fpclass;
    for (lVar15 = 0; lVar15 < (int)((ulong)((long)pnVar7 - (long)pnVar5) >> 7); lVar15 = lVar15 + 1)
    {
      *(char *)(pfVar13 + -1) =
           *(bool *)(pfVar13 + -1) ^
           ((((cpp_dec_float<200U,_int,_void> *)(pfVar13 + -0x1e))->data)._M_elems[0] != 0 ||
           *pfVar13 != cpp_dec_float_finite);
      pfVar13 = pfVar13 + 0x20;
    }
  }
  if (0 < this->m_addedcols) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->m_prim,
            (int)((ulong)((long)(this->m_prim).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_prim).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 7) - this->m_addedcols,
            true);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->m_redCost,
            (int)((ulong)((long)(this->m_redCost).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_redCost).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 7) - this->m_addedcols,
            true);
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::reSize(&this->m_cBasisStat,(this->m_cBasisStat).thesize - this->m_addedcols);
    DataArray<int>::reSize(&this->m_cIdx,(this->m_cIdx).thesize - this->m_addedcols);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::clear(&this_00->data);
  this->m_postsolved = true;
  return;
}

Assistant:

void SPxMainSM<R>::unsimplify(const VectorBase<R>& x, const VectorBase<R>& y,
                              const VectorBase<R>& s, const VectorBase<R>& r,
                              const typename SPxSolverBase<R>::VarStatus rows[],
                              const typename SPxSolverBase<R>::VarStatus cols[], bool isOptimal)
{
   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- unsimplifying solution and basis" << std::endl;)
   assert(x.dim() <= m_prim.dim());
   assert(y.dim() <= m_dual.dim());
   assert(x.dim() == r.dim());
   assert(y.dim() == s.dim());

   // assign values of variables in reduced LP
   // NOTE: for maximization problems, we have to switch signs of dual and reduced cost values,
   // since simplifier assumes minimization problem
   for(int j = 0; j < x.dim(); ++j)
   {
      m_prim[j] = isZero(x[j], this->epsZero()) ? 0.0 : x[j];
      m_redCost[j] = isZero(r[j], this->epsZero()) ? 0.0 : (m_thesense == SPxLPBase<R>::MAXIMIZE ? -r[j] :
                     r[j]);
      m_cBasisStat[j] = cols[j];
   }

   for(int i = 0; i < y.dim(); ++i)
   {
      m_dual[i] = isZero(y[i], this->epsZero()) ? 0.0 : (m_thesense == SPxLPBase<R>::MAXIMIZE ? -y[i] :
                  y[i]);
      m_slack[i] = isZero(s[i], this->epsZero()) ? 0.0 : s[i];
      m_rBasisStat[i] = rows[i];
   }

   // undo preprocessing
   for(int k = m_hist.size() - 1; k >= 0; --k)
   {
      SPxOut::debug(this, "unsimplifying {} \n", m_hist[k]->getName());

      try
      {
         m_hist[k]->execute(m_prim, m_dual, m_slack, m_redCost, m_cBasisStat, m_rBasisStat, isOptimal);
      }
      catch(const SPxException& ex)
      {
         SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Exception thrown while unsimplifying " <<
                       m_hist[k]->getName() << ":\n" << ex.what() << "\n");
         throw SPxInternalCodeException("XMAISM00 Exception thrown during unsimply().");
      }

      m_hist.reSize(k);
   }

   // for maximization problems, we have to switch signs of dual and reduced cost values back
   if(m_thesense == SPxLPBase<R>::MAXIMIZE)
   {
      for(int j = 0; j < m_redCost.dim(); ++j)
         m_redCost[j] = -m_redCost[j];

      for(int i = 0; i < m_dual.dim(); ++i)
         m_dual[i] = -m_dual[i];
   }

   if(m_addedcols > 0)
   {
      assert(m_prim.dim() >= m_addedcols);
      m_prim.reDim(m_prim.dim() - m_addedcols);
      m_redCost.reDim(m_redCost.dim() - m_addedcols);
      m_cBasisStat.reSize(m_cBasisStat.size() - m_addedcols);
      m_cIdx.reSize(m_cIdx.size() - m_addedcols);
   }

#ifdef SOPLEX_CHECK_BASIS_DIM
   int numBasis = 0;

   for(int rs = 0; rs < m_rBasisStat.size(); ++rs)
   {
      if(m_rBasisStat[rs] == SPxSolverBase<R>::BASIC)
         numBasis ++;
   }

   for(int cs = 0; cs < m_cBasisStat.size(); ++cs)
   {
      if(m_cBasisStat[cs] == SPxSolverBase<R>::BASIC)
         numBasis ++;
   }

   if(numBasis != m_rBasisStat.size())
   {
      throw SPxInternalCodeException("XMAISM26 Dimension doesn't match after this step.");
   }

#endif

   m_hist.clear();
   m_postsolved = true;
}